

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
operator()(arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,char_type *value)

{
  char cVar1;
  size_t in_RCX;
  void *in_RDX;
  
  if (this->specs_ != (format_specs *)0x0) {
    cVar1 = (this->specs_->super_core_format_specs).type;
    if (cVar1 != 's') {
      if (cVar1 == 'p') {
        write_pointer(this,value);
        goto LAB_00113681;
      }
      if (cVar1 != '\0') {
        error_handler::on_error((error_handler *)this,"invalid type specifier");
      }
    }
  }
  write(this,(int)value,in_RDX,in_RCX);
LAB_00113681:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const char_type *value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(
          specs_->type, cstring_spec_handler(*this, value));
    return out();
  }